

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void LD4(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int H;
  int G;
  int F;
  int E;
  int D;
  int C;
  int B;
  int A;
  uint8_t *top_local;
  uint8_t *dst_local;
  
  bVar1 = top[1];
  uVar3 = (uint)top[2];
  uVar4 = (uint)top[3];
  uVar5 = (uint)top[4];
  uVar6 = (uint)top[5];
  uVar7 = (uint)top[6];
  uVar8 = (uint)top[7];
  *dst = (uint8_t)((int)((uint)*top + (uint)bVar1 * 2 + uVar3 + 2) >> 2);
  uVar2 = (uint8_t)((int)((uint)bVar1 + uVar3 * 2 + uVar4 + 2) >> 2);
  dst[0x20] = uVar2;
  dst[1] = uVar2;
  uVar2 = (uint8_t)((int)(uVar3 + uVar4 * 2 + uVar5 + 2) >> 2);
  dst[0x40] = uVar2;
  dst[0x21] = uVar2;
  dst[2] = uVar2;
  uVar2 = (uint8_t)((int)(uVar4 + uVar5 * 2 + uVar6 + 2) >> 2);
  dst[0x60] = uVar2;
  dst[0x41] = uVar2;
  dst[0x22] = uVar2;
  dst[3] = uVar2;
  uVar2 = (uint8_t)((int)(uVar5 + uVar6 * 2 + uVar7 + 2) >> 2);
  dst[0x61] = uVar2;
  dst[0x42] = uVar2;
  dst[0x23] = uVar2;
  uVar2 = (uint8_t)((int)(uVar6 + uVar7 * 2 + uVar8 + 2) >> 2);
  dst[0x62] = uVar2;
  dst[0x43] = uVar2;
  dst[99] = (uint8_t)((int)(uVar7 + uVar8 * 2 + uVar8 + 2) >> 2);
  return;
}

Assistant:

static void LD4(uint8_t* WEBP_RESTRICT dst, const uint8_t* WEBP_RESTRICT top) {
  const int A = top[0];
  const int B = top[1];
  const int C = top[2];
  const int D = top[3];
  const int E = top[4];
  const int F = top[5];
  const int G = top[6];
  const int H = top[7];
  DST(0, 0)                                     = AVG3(A, B, C);
  DST(1, 0) = DST(0, 1)                         = AVG3(B, C, D);
  DST(2, 0) = DST(1, 1) = DST(0, 2)             = AVG3(C, D, E);
  DST(3, 0) = DST(2, 1) = DST(1, 2) = DST(0, 3) = AVG3(D, E, F);
  DST(3, 1) = DST(2, 2) = DST(1, 3)             = AVG3(E, F, G);
  DST(3, 2) = DST(2, 3)                         = AVG3(F, G, H);
  DST(3, 3)                                     = AVG3(G, H, H);
}